

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O2

set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *
wasm::anon_unknown_11::parseNameList
          (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
           *__return_storage_ptr__,string *listOrFile)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  istream *piVar3;
  ostream *poVar4;
  istream local_288 [8];
  ifstream infile;
  IString local_80;
  IString local_70 [2];
  undefined1 local_50 [8];
  string line;
  
  if ((listOrFile->_M_string_length == 0) || (*(listOrFile->_M_dataplus)._M_p != '@')) {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_288,(string *)listOrFile,_S_in);
    local_50 = (undefined1  [8])&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_288,(string *)local_50,',');
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      IString::IString(local_70,(string *)local_50);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_M_insert_unique<wasm::Name>(&__return_storage_ptr__->_M_t,(Name *)local_70);
    }
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_288);
  }
  else {
    std::__cxx11::string::substr((ulong)local_70,(ulong)listOrFile);
    std::ifstream::ifstream(local_288,(string *)local_70,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed opening \'");
      poVar4 = std::operator<<(poVar4,(string *)local_70);
      poVar4 = std::operator<<(poVar4,"\'");
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(1);
    }
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_50 = (undefined1  [8])&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_288,(string *)local_50);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      if (line._M_dataplus._M_p != (pointer)0x0) {
        IString::IString(&local_80,(string *)local_50);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::_M_insert_unique<wasm::Name>(&__return_storage_ptr__->_M_t,(Name *)&local_80);
      }
    }
    std::__cxx11::string::~string((string *)local_50);
    std::ifstream::~ifstream(local_288);
    std::__cxx11::string::~string((string *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<Name> parseNameList(const std::string& listOrFile) {
  if (!listOrFile.empty() && listOrFile[0] == '@') {
    return parseNameListFromFile(listOrFile.substr(1));
  }

  return parseNameListFromLine(listOrFile);
}